

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O1

Vec_Flt_t * Abc_SclFindWireCaps(SC_WireLoad *pWL,int nFanoutMax)

{
  float fVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  Vec_Flt_t *pVVar5;
  float *__s;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  
  if (pWL == (SC_WireLoad *)0x0) {
    __assert_fail("pWL != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLoad.c"
                  ,0x32,"Vec_Flt_t *Abc_SclFindWireCaps(SC_WireLoad *, int)");
  }
  iVar8 = (pWL->vFanout).nSize;
  uVar14 = (ulong)iVar8;
  if ((long)uVar14 < 1) {
    uVar13 = 0;
  }
  else {
    uVar6 = 0;
    uVar13 = 0;
    do {
      uVar3 = (pWL->vFanout).pArray[uVar6];
      if ((int)uVar13 <= (int)uVar3) {
        uVar13 = uVar3;
      }
      uVar6 = uVar6 + 1;
    } while (uVar14 != uVar6);
  }
  if ((int)uVar13 < nFanoutMax) {
    uVar13 = nFanoutMax;
  }
  uVar9 = uVar13 + 1;
  pVVar5 = (Vec_Flt_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar13) {
    uVar3 = uVar9;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar3;
  __s = (float *)malloc((long)(int)uVar3 << 2);
  pVVar5->pArray = __s;
  pVVar5->nSize = uVar9;
  uVar6 = 0;
  memset(__s,0,(long)(int)uVar9 << 2);
  if (iVar8 < 1) {
LAB_003f3bb4:
    if (0 < (int)uVar13) {
      fVar16 = __s[1];
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        if (uVar13 == 1) {
          uVar3 = 1;
          uVar14 = 2;
        }
        else {
          uVar3 = 1;
          uVar14 = 2;
          fVar15 = fVar16;
          do {
            fVar1 = __s[uVar14];
            if ((fVar1 != 0.0) || (fVar16 = fVar15, uVar4 = uVar3, NAN(fVar1))) {
              uVar10 = uVar3 + 1;
              uVar4 = (uint)uVar14;
              fVar16 = fVar1;
              if ((long)(int)uVar10 < (long)uVar14) {
                lVar11 = (ulong)uVar10 << 0x20;
                lVar12 = 0;
                do {
                  lVar11 = lVar11 + 0x100000000;
                  iVar8 = uVar3 + (int)lVar12;
                  if ((iVar8 < -1) || ((int)uVar13 <= iVar8)) goto LAB_003f3ce9;
                  __s[(ulong)uVar10 + lVar12] =
                       (float)(int)(lVar12 + 1) * ((fVar1 - fVar15) / (float)(int)(uVar4 - uVar3)) +
                       fVar15;
                  lVar12 = lVar12 + 1;
                } while (lVar11 >> 0x20 < (long)uVar14);
              }
            }
            uVar3 = uVar4;
            uVar14 = uVar14 + 1;
            fVar15 = fVar16;
          } while (uVar14 != uVar9);
        }
        if ((int)(uVar3 + 1) < (int)uVar14) {
          fVar15 = pWL->cap;
          fVar1 = pWL->slope;
          iVar8 = 1;
          uVar9 = uVar3;
          do {
            if (((int)uVar3 < -1) || ((int)uVar13 <= (int)uVar9)) {
LAB_003f3ce9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                            ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
            }
            uVar9 = uVar9 + 1;
            __s[uVar9] = (float)iVar8 * fVar15 * fVar1 + fVar16;
            iVar8 = iVar8 + 1;
          } while ((int)uVar14 - 1U != uVar9);
        }
      }
      return pVVar5;
    }
  }
  else {
    piVar2 = (pWL->vFanout).pArray;
    uVar3 = (pWL->vLen).nSize;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar6;
    }
    while (uVar7 != uVar6) {
      uVar3 = piVar2[uVar6];
      if (((int)uVar3 < 0) || ((int)uVar13 < (int)uVar3)) goto LAB_003f3ce9;
      __s[uVar3] = (pWL->vLen).pArray[uVar6] * pWL->cap;
      uVar6 = uVar6 + 1;
      if (uVar14 == uVar6) goto LAB_003f3bb4;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns estimated wire capacitances for each fanout count.]

  Description []
               
  SideEffects []`

  SeeAlso     []

***********************************************************************/
Vec_Flt_t * Abc_SclFindWireCaps( SC_WireLoad * pWL, int nFanoutMax )
{
    Vec_Flt_t * vCaps = NULL;
    float EntryPrev, EntryCur, Slope;
    int i, iPrev, k, Entry, EntryMax;
    assert( pWL != NULL );
    // find the biggest fanout count
    EntryMax = 0;
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        EntryMax = Abc_MaxInt( EntryMax, Entry );
    // create the array
    vCaps = Vec_FltStart( Abc_MaxInt(nFanoutMax, EntryMax) + 1 );
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        Vec_FltWriteEntry( vCaps, Entry, Vec_FltEntry(&pWL->vLen, i) * pWL->cap );
    if ( Vec_FltEntry(vCaps, 1) == 0 )
        return vCaps;
    // interpolate between the values
    assert( Vec_FltEntry(vCaps, 1) != 0 );
    iPrev = 1;
    EntryPrev = Vec_FltEntry(vCaps, 1);
    Vec_FltForEachEntryStart( vCaps, EntryCur, i, 2 )
    {
        if ( EntryCur == 0 )
            continue;
        Slope = (EntryCur - EntryPrev) / (i - iPrev);
        for ( k = iPrev + 1; k < i; k++ )
            Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
        EntryPrev = EntryCur;
        iPrev = i;
    }
    // extrapolate after the largest value
    Slope = pWL->cap * pWL->slope;
    for ( k = iPrev + 1; k < i; k++ )
        Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
    // show
//    Vec_FltForEachEntry( vCaps, EntryCur, i )
//        printf( "%3d : %f\n", i, EntryCur );
    return vCaps;
}